

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  value_type vVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  vVar8 = FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>::fastAccessDx
                    (&this->left_->fadexpr_,i);
  dVar9 = sin(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar6 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar7 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar1 = pFVar7->val_;
  dVar2 = pFVar6->val_;
  dVar3 = (pFVar7->dx_).ptr_to_data[i];
  dVar4 = (pFVar6->dx_).ptr_to_data[i];
  dVar10 = cos(dVar1 * dVar2);
  dVar5 = ((this->left_->fadexpr_).left_)->val_;
  dVar11 = ::exp((((this->left_->fadexpr_).right_)->fadexpr_).expr_.val_);
  return dVar11 * dVar5 * dVar10 * (dVar4 * dVar1 + dVar3 * dVar2) + dVar9 * vVar8;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}